

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O3

int Fraig_ManCheckClauseUsingSat
              (Fraig_Man_t *p,Fraig_Node_t *pNode1,Fraig_Node_t *pNode2,int nBTLimit)

{
  Fraig_Node_t *pFVar1;
  int iVar2;
  int iVar3;
  Fraig_NodeVec_t *pFVar4;
  long lVar5;
  Msat_Solver_t *p_00;
  uint uVar6;
  Fraig_Node_t *pOld;
  uint uVar7;
  long lVar8;
  Fraig_Node_t *pNew;
  timespec ts;
  timespec local_50;
  Fraig_Node_t *local_40;
  int local_34;
  
  pOld = (Fraig_Node_t *)((ulong)pNode1 & 0xfffffffffffffffe);
  pNew = (Fraig_Node_t *)((ulong)pNode2 & 0xfffffffffffffffe);
  local_40 = pNode1;
  if (pOld == pNew) {
    __assert_fail("pNode1R != pNode2R",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigSat.c"
                  ,0x296,
                  "int Fraig_ManCheckClauseUsingSat(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *, int)"
                 );
  }
  p_00 = p->pSat;
  if (p_00 == (Msat_Solver_t *)0x0) {
    Fraig_ManCreateSolver(p);
    p_00 = p->pSat;
  }
  iVar2 = Msat_SolverReadVarNum(p_00);
  pFVar4 = p->vNodes;
  if (iVar2 < pFVar4->nSize) {
    lVar8 = (long)iVar2;
    do {
      Msat_SolverAddVar(p->pSat,pFVar4->pArray[lVar8]->Level);
      lVar8 = lVar8 + 1;
      pFVar4 = p->vNodes;
    } while (lVar8 < pFVar4->nSize);
  }
  local_34 = nBTLimit;
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  Fraig_OrderVariables(p,pOld,pNew);
  iVar2 = clock_gettime(3,&local_50);
  pFVar1 = local_40;
  if (iVar2 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  p->timeTrav = p->timeTrav + lVar5 + lVar8;
  Msat_SolverPrepare(p->pSat,p->vVarsInt);
  Msat_IntVecClear(p->vProj);
  uVar6 = (uint)pFVar1 & 1;
  Msat_IntVecPush(p->vProj,uVar6 + pOld->Num * 2 ^ 1);
  uVar7 = (uint)pNode2 & 1;
  Msat_IntVecPush(p->vProj,uVar7 + pNew->Num * 2 ^ 1);
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  local_40 = (Fraig_Node_t *)(ulong)uVar7;
  iVar2 = Msat_SolverSolve(p->pSat,p->vProj,local_34,1000000);
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  p->timeSat = p->timeSat + lVar5 + lVar8;
  if (iVar2 == 1) {
    p->nSatCounterImp = p->nSatCounterImp + 1;
  }
  else {
    if (iVar2 == -1) {
      Msat_IntVecClear(p->vProj);
      Msat_IntVecPush(p->vProj,uVar6 + pOld->Num * 2);
      Msat_IntVecPush(p->vProj,(int)local_40 + pNew->Num * 2);
      iVar2 = Msat_SolverAddClause(p->pSat,p->vProj);
      if (iVar2 != 0) {
        return 1;
      }
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigSat.c"
                    ,0x2c4,
                    "int Fraig_ManCheckClauseUsingSat(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *, int)"
                   );
    }
    iVar2 = clock_gettime(3,&local_50);
    if (iVar2 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    p->time3 = p->time3 + lVar5 + lVar8;
    p->nSatFailsImp = p->nSatFailsImp + 1;
  }
  return 0;
}

Assistant:

int Fraig_ManCheckClauseUsingSat( Fraig_Man_t * p, Fraig_Node_t * pNode1, Fraig_Node_t * pNode2, int nBTLimit )
{
    Fraig_Node_t * pNode1R, * pNode2R;
    int RetValue, RetValue1, i;
    abctime clk;
    int fVerbose = 0;

    pNode1R = Fraig_Regular(pNode1);
    pNode2R = Fraig_Regular(pNode2);
    assert( pNode1R != pNode2R );

    // make sure the solver is allocated and has enough variables
    if ( p->pSat == NULL )
        Fraig_ManCreateSolver( p );
    // make sure the SAT solver has enough variables
    for ( i = Msat_SolverReadVarNum(p->pSat); i < p->vNodes->nSize; i++ )
        Msat_SolverAddVar( p->pSat, p->vNodes->pArray[i]->Level );

   // get the logic cone
clk = Abc_Clock();
    Fraig_OrderVariables( p, pNode1R, pNode2R );
//    Fraig_PrepareCones( p, pNode1R, pNode2R );
p->timeTrav += Abc_Clock() - clk;

    ////////////////////////////////////////////
    // prepare the solver to run incrementally on these variables
//clk = Abc_Clock();
    Msat_SolverPrepare( p->pSat, p->vVarsInt );
//p->time3 += Abc_Clock() - clk;

    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
    Msat_IntVecClear( p->vProj );
    Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pNode1R->Num, !Fraig_IsComplement(pNode1)) );
    Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pNode2R->Num, !Fraig_IsComplement(pNode2)) );
    // run the solver
clk = Abc_Clock();
    RetValue1 = Msat_SolverSolve( p->pSat, p->vProj, nBTLimit, 1000000 );
p->timeSat += Abc_Clock() - clk;

    if ( RetValue1 == MSAT_FALSE )
    {
//p->time1 += Abc_Clock() - clk;

if ( fVerbose )
{
//    printf( "unsat  %d  ", Msat_SolverReadBackTracks(p->pSat) );
//ABC_PRT( "time", Abc_Clock() - clk );
}

        // add the clause
        Msat_IntVecClear( p->vProj );
        Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pNode1R->Num, Fraig_IsComplement(pNode1)) );
        Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pNode2R->Num, Fraig_IsComplement(pNode2)) );
        RetValue = Msat_SolverAddClause( p->pSat, p->vProj );
        assert( RetValue );
//        p->nSatProofImp++;
        return 1;
    }
    else if ( RetValue1 == MSAT_TRUE )
    {
//p->time2 += Abc_Clock() - clk;

if ( fVerbose )
{
//    printf( "sat  %d  ", Msat_SolverReadBackTracks(p->pSat) );
//ABC_PRT( "time", Abc_Clock() - clk );
}
        // record the counter example
//        Fraig_FeedBack( p, Msat_SolverReadModelArray(p->pSat), p->vVarsInt, pNode1R, pNode2R );
        p->nSatCounterImp++;
        return 0;
    }
    else // if ( RetValue1 == MSAT_UNKNOWN )
    {
p->time3 += Abc_Clock() - clk;
        p->nSatFailsImp++;
        return 0;
    }
}